

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::ShaderOptimizationTests::init
          (ShaderOptimizationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  undefined4 uVar2;
  CaseShaderType caseShaderType;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  TestCaseGroup *this_03;
  TestCaseGroup *this_04;
  TestCaseGroup *this_05;
  ShaderOptimizationCase *pSVar3;
  bool *__rhs;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *description_00;
  long lVar7;
  int loopIterations;
  ShaderOptimizationTests *local_130;
  char *local_128;
  string caseTypeName;
  string name;
  string caseTypeDesc;
  string description;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"loop_unrolling","Loop Unrolling Cases");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"loop_invariant_code_motion",
             "Loop-Invariant Code Motion Cases");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).m_context,"function_inlining",
             "Function Inlining Cases");
  this_03 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_03,(this->super_TestCaseGroup).m_context,"constant_propagation",
             "Constant Propagation Cases");
  this_04 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_04,(this->super_TestCaseGroup).m_context,"common_subexpression_elimination",
             "Common Subexpression Elimination Cases");
  this_05 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_05,(this->super_TestCaseGroup).m_context,"dead_code_elimination",
             "Dead Code Elimination Cases");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  local_130 = this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  caseShaderType = CASESHADERTYPE_VERTEX;
LAB_00f4c2d5:
  if (caseShaderType == CASESHADERTYPE_LAST) {
    return 2;
  }
  local_128 = "_fragment";
  if (caseShaderType == CASESHADERTYPE_VERTEX) {
    local_128 = "_vertex";
  }
  iVar4 = 0;
  while( true ) {
    if (iVar4 == 2) break;
    pcVar6 = "dependent_iterations";
    if (iVar4 == 0) {
      pcVar6 = "independent_iterations";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseTypeName,pcVar6,(allocator<char> *)&caseTypeDesc);
    pcVar6 = "loop iterations depend on each other";
    if (iVar4 == 0) {
      pcVar6 = "loop iterations don\'t depend on each other";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseTypeDesc,pcVar6,(allocator<char> *)&name);
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
      loopIterations = *(int *)((long)init()::callNestingDepths + lVar7);
      std::operator+(&local_50,&caseTypeName,"_");
      de::toString<int>(&local_70,&loopIterations);
      std::operator+(&description,&local_50,&local_70);
      std::operator+(&name,&description,local_128);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      de::toString<int>(&local_70,&loopIterations);
      std::operator+(&local_50,&local_70," iterations; ");
      std::operator+(&description,&local_50,&caseTypeDesc);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      pSVar3 = (ShaderOptimizationCase *)operator_new(0x358);
      iVar5 = loopIterations;
      anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                (pSVar3,(local_130->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 (char *)CONCAT44(description._M_dataplus._M_p._4_4_,
                                  description._M_dataplus._M_p._0_4_),caseShaderType);
      (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderOptimizationCase_01e27640;
      *(int *)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar5;
      *(int *)((long)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
           iVar4;
      tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pSVar3);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&name);
    }
    std::__cxx11::string::~string((string *)&caseTypeDesc);
    std::__cxx11::string::~string((string *)&caseTypeName);
    iVar4 = iVar4 + 1;
  }
  for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
    description._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)init()::callNestingDepths + lVar7);
    de::toString<int>(&name,(int *)&description);
    std::operator+(&caseTypeDesc,&name,"_iterations");
    std::operator+(&caseTypeName,&caseTypeDesc,local_128);
    std::__cxx11::string::~string((string *)&caseTypeDesc);
    std::__cxx11::string::~string((string *)&name);
    pSVar3 = (ShaderOptimizationCase *)operator_new(0x358);
    uVar2 = description._M_dataplus._M_p._0_4_;
    anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
              (pSVar3,(local_130->super_TestCaseGroup).m_context,caseTypeName._M_dataplus._M_p,
               glcts::fixed_sample_locations_values + 1,caseShaderType);
    (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderOptimizationCase_01e276f0;
    *(undefined4 *)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2;
    tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)pSVar3);
    std::__cxx11::string::~string((string *)&caseTypeName);
  }
  for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
    description._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)init()::callNestingDepths + lVar7);
    de::toString<int>(&name,(int *)&description);
    std::operator+(&caseTypeDesc,&name,"_nested");
    std::operator+(&caseTypeName,&caseTypeDesc,local_128);
    std::__cxx11::string::~string((string *)&caseTypeDesc);
    std::__cxx11::string::~string((string *)&name);
    pSVar3 = (ShaderOptimizationCase *)operator_new(0x358);
    uVar2 = description._M_dataplus._M_p._0_4_;
    anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
              (pSVar3,(local_130->super_TestCaseGroup).m_context,caseTypeName._M_dataplus._M_p,
               glcts::fixed_sample_locations_values + 1,caseShaderType);
    (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderOptimizationCase_01e27748;
    *(undefined4 *)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar3);
    std::__cxx11::string::~string((string *)&caseTypeName);
  }
  for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
    pcVar6 = "struct";
    if (iVar4 == 1) {
      pcVar6 = "array";
    }
    if (iVar4 == 0) {
      pcVar6 = "built_in_functions";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseTypeName,pcVar6,(allocator<char> *)&caseTypeDesc);
    iVar5 = 0;
    while( true ) {
      if (iVar5 == 2) break;
      __rhs = (bool *)0x183534a;
      if (iVar5 != 0) {
        __rhs = glcts::fixed_sample_locations_values + 1;
      }
      std::operator+(&name,&caseTypeName,__rhs);
      std::operator+(&caseTypeDesc,&name,local_128);
      std::__cxx11::string::~string((string *)&name);
      if (iVar4 != 1 || iVar5 == 0) {
        pSVar3 = (ShaderOptimizationCase *)operator_new(0x358);
        anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
                  (pSVar3,(local_130->super_TestCaseGroup).m_context,caseTypeDesc._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,caseShaderType);
        (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__ShaderOptimizationCase_01e277a0;
        *(int *)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar4;
        *(char *)((long)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)
             = (char)iVar5;
        tcu::TestNode::addChild((TestNode *)this_03,(TestNode *)pSVar3);
      }
      std::__cxx11::string::~string((string *)&caseTypeDesc);
      iVar5 = iVar5 + 1;
    }
    std::__cxx11::string::~string((string *)&caseTypeName);
  }
  for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
    pcVar6 = "loop";
    if (iVar4 == 2) {
      pcVar6 = "static_branch";
    }
    if (iVar4 == 1) {
      pcVar6 = "multiple_statements";
    }
    if (iVar4 == 0) {
      pcVar6 = "single_statement";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseTypeName,pcVar6,(allocator<char> *)&caseTypeDesc);
    pcVar6 = "Multiple loops performing the same computations";
    if (iVar4 == 2) {
      pcVar6 = "Multiple statements including a static conditional";
    }
    if (iVar4 == 1) {
      pcVar6 = "Multiple statements performing same computations";
    }
    if (iVar4 == 0) {
      pcVar6 = "A single statement containing multiple uses of same subexpression";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&caseTypeDesc,pcVar6,(allocator<char> *)&name);
    pSVar3 = (ShaderOptimizationCase *)operator_new(0x358);
    pCVar1 = (local_130->super_TestCaseGroup).m_context;
    std::operator+(&name,&caseTypeName,local_128);
    anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
              (pSVar3,pCVar1,name._M_dataplus._M_p,caseTypeDesc._M_dataplus._M_p,caseShaderType);
    (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderOptimizationCase_01e277f8;
    *(int *)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar4;
    tcu::TestNode::addChild((TestNode *)this_04,(TestNode *)pSVar3);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&caseTypeDesc);
    std::__cxx11::string::~string((string *)&caseTypeName);
  }
  iVar4 = 0;
  do {
    pcVar6 = "dead_branch_simple";
    description_00 =
         "Do computation inside a branch that is never taken (condition is simple false constant expression)"
    ;
    switch(iVar4) {
    case 0:
      break;
    case 1:
      pcVar6 = "dead_branch_complex";
      description_00 =
           "Do computation inside a branch that is never taken (condition is complex false constant expression)"
      ;
      break;
    case 2:
      pcVar6 = "dead_branch_complex_no_const";
      description_00 =
           "Do computation inside a branch that is never taken (condition is complex false expression, not constant expression but still compile-time computable)"
      ;
      break;
    case 3:
      pcVar6 = "dead_branch_func_call";
      description_00 =
           "Do computation inside a branch that is never taken (condition is compile-time computable false expression containing function call to a simple inlineable function)"
      ;
      break;
    case 4:
      pcVar6 = "unused_value_basic";
      description_00 = "Compute a value that is never used even statically";
      break;
    case 5:
      pcVar6 = "unused_value_loop";
      description_00 = "Compute a value, using a loop, that is never used even statically";
      break;
    case 6:
      pcVar6 = "unused_value_dead_branch";
      description_00 = "Compute a value that is used only inside a statically dead branch";
      break;
    case 7:
      pcVar6 = "unused_value_after_return";
      description_00 = "Compute a value that is used only after a return statement";
      break;
    default:
      pcVar6 = "unused_value_mul_zero";
      description_00 = "Compute a value that is used but multiplied by a zero constant expression";
      break;
    case 9:
      goto switchD_00f4c8c4_caseD_9;
    }
    pSVar3 = (ShaderOptimizationCase *)operator_new(0x358);
    pCVar1 = (local_130->super_TestCaseGroup).m_context;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    std::operator+(&caseTypeDesc,&name,pcVar6);
    std::operator+(&caseTypeName,&caseTypeDesc,local_128);
    anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
              (pSVar3,pCVar1,caseTypeName._M_dataplus._M_p,description_00,caseShaderType);
    (pSVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ShaderOptimizationCase_01e27850;
    *(int *)&pSVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar4;
    tcu::TestNode::addChild((TestNode *)this_05,(TestNode *)pSVar3);
    std::__cxx11::string::~string((string *)&caseTypeName);
    std::__cxx11::string::~string((string *)&caseTypeDesc);
    std::__cxx11::string::~string((string *)&name);
    iVar4 = iVar4 + 1;
  } while( true );
switchD_00f4c8c4_caseD_9:
  caseShaderType = caseShaderType + CASESHADERTYPE_FRAGMENT;
  goto LAB_00f4c2d5;
}

Assistant:

void ShaderOptimizationTests::init (void)
{
	TestCaseGroup* const unrollGroup					= new TestCaseGroup(m_context, "loop_unrolling",					"Loop Unrolling Cases");
	TestCaseGroup* const loopInvariantCodeMotionGroup	= new TestCaseGroup(m_context, "loop_invariant_code_motion",		"Loop-Invariant Code Motion Cases");
	TestCaseGroup* const inlineGroup					= new TestCaseGroup(m_context, "function_inlining",					"Function Inlining Cases");
	TestCaseGroup* const constantPropagationGroup		= new TestCaseGroup(m_context, "constant_propagation",				"Constant Propagation Cases");
	TestCaseGroup* const commonSubexpressionGroup		= new TestCaseGroup(m_context, "common_subexpression_elimination",	"Common Subexpression Elimination Cases");
	TestCaseGroup* const deadCodeEliminationGroup		= new TestCaseGroup(m_context, "dead_code_elimination",				"Dead Code Elimination Cases");
	addChild(unrollGroup);
	addChild(loopInvariantCodeMotionGroup);
	addChild(inlineGroup);
	addChild(constantPropagationGroup);
	addChild(commonSubexpressionGroup);
	addChild(deadCodeEliminationGroup);

	for (int caseShaderTypeI = 0; caseShaderTypeI < CASESHADERTYPE_LAST; caseShaderTypeI++)
	{
		const CaseShaderType	caseShaderType			= (CaseShaderType)caseShaderTypeI;
		const char* const		caseShaderTypeSuffix	= caseShaderType == CASESHADERTYPE_VERTEX		? "_vertex"
														: caseShaderType == CASESHADERTYPE_FRAGMENT		? "_fragment"
														: DE_NULL;

		// Loop unrolling cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int caseTypeI = 0; caseTypeI < LoopUnrollCase::CASETYPE_LAST; caseTypeI++)
			{
				const LoopUnrollCase::CaseType	caseType		= (LoopUnrollCase::CaseType)caseTypeI;
				const string					caseTypeName	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "independent_iterations"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "dependent_iterations"
																: DE_NULL;
				const string					caseTypeDesc	= caseType == LoopUnrollCase::CASETYPE_INDEPENDENT	? "loop iterations don't depend on each other"
																: caseType == LoopUnrollCase::CASETYPE_DEPENDENT	? "loop iterations depend on each other"
																: DE_NULL;

				for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
				{
					const int			loopIterations	= loopIterationCounts[loopIterNdx];
					const string		name			= caseTypeName + "_" + toString(loopIterations) + caseShaderTypeSuffix;
					const string		description		= toString(loopIterations) + " iterations; " + caseTypeDesc;

					unrollGroup->addChild(new LoopUnrollCase(m_context, name.c_str(), description.c_str(), caseShaderType, caseType, loopIterations));
				}
			}
		}

		// Loop-invariant code motion cases.

		{
			static const int loopIterationCounts[] = { 4, 8, 32 };

			for (int loopIterNdx = 0; loopIterNdx < DE_LENGTH_OF_ARRAY(loopIterationCounts); loopIterNdx++)
			{
				const int		loopIterations	= loopIterationCounts[loopIterNdx];
				const string	name			= toString(loopIterations) + "_iterations" + caseShaderTypeSuffix;

				loopInvariantCodeMotionGroup->addChild(new LoopInvariantCodeMotionCase(m_context, name.c_str(), "", caseShaderType, loopIterations));
			}
		}

		// Function inlining cases.

		{
			static const int callNestingDepths[] = { 4, 8, 32 };

			for (int nestDepthNdx = 0; nestDepthNdx < DE_LENGTH_OF_ARRAY(callNestingDepths); nestDepthNdx++)
			{
				const int		nestingDepth	= callNestingDepths[nestDepthNdx];
				const string	name			= toString(nestingDepth) + "_nested" + caseShaderTypeSuffix;

				inlineGroup->addChild(new FunctionInliningCase(m_context, name.c_str(), "", caseShaderType, nestingDepth));
			}
		}

		// Constant propagation cases.

		for (int caseTypeI = 0; caseTypeI < ConstantPropagationCase::CASETYPE_LAST; caseTypeI++)
		{
			const ConstantPropagationCase::CaseType		caseType		= (ConstantPropagationCase::CaseType)caseTypeI;
			const string								caseTypeName	= caseType == ConstantPropagationCase::CASETYPE_BUILT_IN_FUNCTIONS		? "built_in_functions"
																		: caseType == ConstantPropagationCase::CASETYPE_ARRAY					? "array"
																		: caseType == ConstantPropagationCase::CASETYPE_STRUCT					? "struct"
																		: DE_NULL;

			for (int constantExpressionsOnlyI = 0; constantExpressionsOnlyI <= 1; constantExpressionsOnlyI++)
			{
				const bool		constantExpressionsOnly		= constantExpressionsOnlyI != 0;
				const string	name						= caseTypeName + (constantExpressionsOnly ? "" : "_no_const") + caseShaderTypeSuffix;

				if (caseType == ConstantPropagationCase::CASETYPE_ARRAY && constantExpressionsOnly) // \note See ConstantPropagationCase's constructor for explanation.
					continue;

				constantPropagationGroup->addChild(new ConstantPropagationCase(m_context, name.c_str(), "", caseShaderType, caseType, constantExpressionsOnly));
			}
		}

		// Common subexpression cases.

		for (int caseTypeI = 0; caseTypeI < CommonSubexpressionCase::CASETYPE_LAST; caseTypeI++)
		{
			const CommonSubexpressionCase::CaseType		caseType		= (CommonSubexpressionCase::CaseType)caseTypeI;

			const string								caseTypeName	= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "single_statement"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "multiple_statements"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "static_branch"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "loop"
																		: DE_NULL;

			const string								description		= caseType == CommonSubexpressionCase::CASETYPE_SINGLE_STATEMENT		? "A single statement containing multiple uses of same subexpression"
																		: caseType == CommonSubexpressionCase::CASETYPE_MULTIPLE_STATEMENTS		? "Multiple statements performing same computations"
																		: caseType == CommonSubexpressionCase::CASETYPE_STATIC_BRANCH			? "Multiple statements including a static conditional"
																		: caseType == CommonSubexpressionCase::CASETYPE_LOOP					? "Multiple loops performing the same computations"
																		: DE_NULL;

			commonSubexpressionGroup->addChild(new CommonSubexpressionCase(m_context, (caseTypeName + caseShaderTypeSuffix).c_str(), description.c_str(), caseShaderType, caseType));
		}

		// Dead code elimination cases.

		for (int caseTypeI = 0; caseTypeI < DeadCodeEliminationCase::CASETYPE_LAST; caseTypeI++)
		{
			const DeadCodeEliminationCase::CaseType		caseType				= (DeadCodeEliminationCase::CaseType)caseTypeI;
			const char* const							caseTypeName			= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "dead_branch_simple"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "dead_branch_complex"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "dead_branch_complex_no_const"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "dead_branch_func_call"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "unused_value_basic"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "unused_value_loop"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "unused_value_dead_branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "unused_value_after_return"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "unused_value_mul_zero"
																				: DE_NULL;

			const char* const							caseTypeDescription		= caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_SIMPLE				? "Do computation inside a branch that is never taken (condition is simple false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX				? "Do computation inside a branch that is never taken (condition is complex false constant expression)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_COMPLEX_NO_CONST	? "Do computation inside a branch that is never taken (condition is complex false expression, not constant expression but still compile-time computable)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_DEAD_BRANCH_FUNC_CALL			? "Do computation inside a branch that is never taken (condition is compile-time computable false expression containing function call to a simple inlineable function)"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_BASIC				? "Compute a value that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_LOOP				? "Compute a value, using a loop, that is never used even statically"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_DEAD_BRANCH		? "Compute a value that is used only inside a statically dead branch"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_AFTER_RETURN		? "Compute a value that is used only after a return statement"
																				: caseType == DeadCodeEliminationCase::CASETYPE_UNUSED_VALUE_MUL_ZERO			? "Compute a value that is used but multiplied by a zero constant expression"
																				: DE_NULL;

			deadCodeEliminationGroup->addChild(new DeadCodeEliminationCase(m_context, (string() + caseTypeName + caseShaderTypeSuffix).c_str(), caseTypeDescription, caseShaderType, caseType));
		}
	}
}